

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::shift<(moira::Instr)69,(moira::Size)2>(Moira *this,int cnt,u64 data)

{
  bool bVar1;
  u32 uVar2;
  u64 in_RDX;
  int in_ESI;
  long in_RDI;
  int i;
  bool carry;
  undefined4 local_20;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = false;
  local_18 = in_RDX;
  for (local_20 = 0; local_20 < in_ESI; local_20 = local_20 + 1) {
    local_19 = NBIT<(moira::Size)2>(local_18);
    local_18 = local_18 << 1;
  }
  if (in_ESI != 0) {
    *(bool *)(in_RDI + 0x5c9a) = local_19;
  }
  *(bool *)(in_RDI + 0x5c9e) = local_19;
  *(undefined1 *)(in_RDI + 0x5c9d) = 0;
  bVar1 = NBIT<(moira::Size)2>(local_18);
  *(bool *)(in_RDI + 0x5c9b) = bVar1;
  bVar1 = ZERO<(moira::Size)2>(local_18);
  *(bool *)(in_RDI + 0x5c9c) = bVar1;
  uVar2 = CLIP<(moira::Size)2>(local_18);
  return uVar2;
}

Assistant:

u32
Moira::shift(int cnt, u64 data) {

    switch(I) {

        case ASL:
        {
            bool carry = false;
            u32 changed = 0;
            for (int i = 0; i < cnt; i++) {
                carry = NBIT<S>(data);
                u64 shifted = data << 1;
                changed |= data ^ shifted;
                data = shifted;
            }
            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = NBIT<S>(changed);
            break;
        }
        case ASR:
        {
            bool carry = false;
            u32 changed = 0;
            for (int i = 0; i < cnt; i++) {
                carry = data & 1;
                u64 shifted = SEXT<S>(data) >> 1;
                changed |= data ^ shifted;
                data = shifted;
            }
            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = NBIT<S>(changed);
            break;
        }
        case LSL:
        {
            bool carry = false;
            for (int i = 0; i < cnt; i++) {
                carry = NBIT<S>(data);
                data = data << 1;
            }
            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case LSR:
        {
            bool carry = false;
            for (int i = 0; i < cnt; i++) {
                carry = data & 1;
                data = data >> 1;
            }
            if (cnt) reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case ROL:
        {
            bool carry = false;
            for (int i = 0; i < cnt; i++) {
                carry = NBIT<S>(data);
                data = data << 1 | (carry ? 1 : 0);
            }
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case ROR:
        {
            bool carry = false;
            for (int i = 0; i < cnt; i++) {
                carry = data & 1;
                data >>= 1;
                if (carry) data |= MSBIT<S>();
            }
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case ROXL:
        {
            bool carry = reg.sr.x;
            for (int i = 0; i < cnt; i++) {
                bool extend = carry;
                carry = NBIT<S>(data);
                data = data << 1 | (extend ? 1 : 0);
            }

            reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        case ROXR:
        {
            bool carry = reg.sr.x;
            for (int i = 0; i < cnt; i++) {
                bool extend = carry;
                carry = data & 1;
                data >>= 1;
                if (extend) data |= MSBIT<S>();
            }

            reg.sr.x = carry;
            reg.sr.c = carry;
            reg.sr.v = 0;
            break;
        }
        default:
        {
            assert(false);
        }
    }
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    return CLIP<S>(data);
}